

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileloader.cpp
# Opt level: O3

void file_loader(char *filename,
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *param,int *car_capacity,int *num_car)

{
  char cVar1;
  char cVar2;
  istream *piVar3;
  ostream *poVar4;
  long *plVar5;
  int iVar6;
  int tmp;
  string line;
  vector<int,_std::allocator<int>_> tmp_vec;
  ifstream ifs;
  stringstream ss;
  stringstream ss_1;
  int local_58c;
  undefined1 *local_588;
  long local_580;
  undefined1 local_578 [16];
  void *local_568;
  iterator iStack_560;
  int *local_558;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_550;
  long local_548 [65];
  stringstream local_340 [128];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_550 = param;
  std::ifstream::ifstream((istream *)local_548,filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_588 = local_578;
    local_580 = 0;
    local_578[0] = 0;
    iVar6 = 4;
    do {
      cVar1 = (char)(istream *)local_548;
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_548[0] + -0x18) + cVar1);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_548,(string *)&local_588,cVar2);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    cVar1 = std::ios::widen(cVar1 + (char)*(undefined8 *)(local_548[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_548,(string *)&local_588,cVar1);
    std::__cxx11::stringstream::stringstream(local_340,(string *)&local_588,_S_out|_S_in);
    piVar3 = (istream *)std::istream::operator>>((istream *)local_340,num_car);
    std::istream::operator>>(piVar3,car_capacity);
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_548[0] + -0x18) +
                              (char)(istream *)local_548);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_548,(string *)&local_588,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_580 - 0x42U < 10) {
        std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_588,_S_out|_S_in);
        local_568 = (void *)0x0;
        iStack_560._M_current = (int *)0x0;
        local_558 = (int *)0x0;
        while( true ) {
          plVar5 = (long *)std::istream::operator>>((istream *)local_1b8,&local_58c);
          if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
          if (iStack_560._M_current == local_558) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_568,iStack_560,&local_58c);
          }
          else {
            *iStack_560._M_current = local_58c;
            iStack_560._M_current = iStack_560._M_current + 1;
          }
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(local_550,(value_type *)&local_568);
        if (local_568 != (void *)0x0) {
          operator_delete(local_568);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
      }
    }
    std::ifstream::close();
    std::__cxx11::stringstream::~stringstream(local_340);
    std::ios_base::~ios_base(local_2c0);
    if (local_588 != local_578) {
      operator_delete(local_588);
    }
    std::ifstream::~ifstream(local_548);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error, cannot open file, check argv: ",0x25);
  poVar4 = std::operator<<((ostream *)&std::cerr,filename);
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(1);
}

Assistant:

void file_loader (const char *filename, 
				std::vector<std::vector<int> > &param, 
				int &car_capacity, int &num_car)
{
	//https://qiita.com/Reed_X1319RAY/items/098596cda78e9c1a6bad
	std::ifstream ifs(filename, std::ios::in);
	if(!ifs.is_open()){
		std::cerr << "Error, cannot open file, check argv: " << filename << std::endl;
		std::exit(1); 
	}
   std::string line;
   for(int i = 0; i < 4; i++){
   	std::getline(ifs, line);
   }
   std::getline(ifs, line);
   std::stringstream ss(line);
   ss >> num_car >> car_capacity;
   while (std::getline(ifs, line)){
   	std::cout << line.size() << std::endl;
	   if(66 <= line.size() && line.size() <= 75){
	    	std::stringstream ss(line);
	      std::vector<int> tmp_vec;
	      int tmp;
	      while (ss >> tmp){
	      	tmp_vec.push_back(tmp);
	      }
	      param.push_back(tmp_vec);
	   }
   }
   ifs.close();
}